

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  pointer ppcVar5;
  uint uVar6;
  pointer ppcVar7;
  ulong uVar8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> autogenTargets;
  _Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->FilesReplacedDuringGenerate);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0042WarnTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0068WarnTargets)._M_t);
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x2a])(this);
  uVar8 = 0;
  if ((char)iVar4 == '\0') goto LAB_00358f72;
  FinalizeTargetCompileInfo(this);
  CreateGenerationObjects(this,AllTargets);
  FillProjectMap(this);
  CreateQtAutoGeneratorsTargets
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             &local_38,this);
  for (; ppcVar1 = (this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3);
      uVar8 = (ulong)((int)uVar8 + 1)) {
    (*ppcVar1[uVar8]->_vptr_cmLocalGenerator[4])();
  }
  uVar6 = 0;
  do {
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar7 = local_38._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar6) goto LAB_00358e4a;
    bVar3 = cmLocalGenerator::ComputeTargetCompileFeatures(ppcVar1[uVar6]);
    uVar6 = uVar6 + 1;
  } while (bVar3);
  uVar8 = 0;
  goto LAB_00358f6a;
LAB_00358e4a:
  for (; ppcVar7 != local_38._M_impl.super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*ppcVar7);
  }
  uVar6 = 0;
  while( true ) {
    uVar8 = (ulong)uVar6;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar8)
    break;
    pcVar2 = ppcVar1[uVar8]->Makefile;
    for (ppcVar5 = (pcVar2->InstallGenerators).
                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar5 !=
        (pcVar2->InstallGenerators).
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
      (*((*ppcVar5)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])
                (*ppcVar5,(this->LocalGenerators).
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8]);
    }
    uVar6 = uVar6 + 1;
  }
  (*this->_vptr_cmGlobalGenerator[10])(this);
  uVar6 = 0;
  while( true ) {
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar6) break;
    cmLocalGenerator::TraceDependencies(ppcVar1[uVar6]);
    uVar6 = uVar6 + 1;
  }
  (*this->_vptr_cmGlobalGenerator[0x2c])(this);
  uVar6 = 0;
  while( true ) {
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar6) break;
    cmLocalGenerator::ComputeTargetManifest(ppcVar1[uVar6]);
    uVar6 = uVar6 + 1;
  }
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x29])(this);
  uVar8 = 0;
  if ((char)iVar4 != '\0') {
    for (; ppcVar1 = (this->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->LocalGenerators).
                              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3);
        uVar8 = (ulong)((int)uVar8 + 1)) {
      (*ppcVar1[uVar8]->_vptr_cmLocalGenerator[3])();
    }
    uVar8 = 1;
  }
LAB_00358f6a:
  std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
  ~_Vector_base(&local_38);
LAB_00358f72:
  return SUB81(uVar8,0);
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  std::vector<cmGeneratorTarget const*> autogenTargets =
    this->CreateQtAutoGeneratorsTargets();
#endif

  unsigned int i;

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->AddHelperCommands();
  }

  // Finalize the set of compile features for each target.
  // FIXME: This turns into calls to cmMakefile::AddRequiredTargetFeature
  // which actually modifies the <lang>_STANDARD target property
  // on the original cmTarget instance.  It accumulates features
  // across all configurations.  Some refactoring is needed to
  // compute a per-config resulta purely during generation.
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    if (!this->LocalGenerators[i]->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (std::vector<cmGeneratorTarget const*>::iterator it =
         autogenTargets.begin();
       it != autogenTargets.end(); ++it) {
    cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*it);
  }
#endif

  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    std::vector<cmInstallGenerator*>& gens = mf->GetInstallGenerators();
    for (std::vector<cmInstallGenerator*>::const_iterator git = gens.begin();
         git != gens.end(); ++git) {
      (*git)->Compute(this->LocalGenerators[i]);
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->TraceDependencies();
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }

  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
  }

  return true;
}